

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool leveldb::FindLargestKey
               (InternalKeyComparator *icmp,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files,
               InternalKey *largest_key)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  InternalKey *pIVar4;
  const_reference ppFVar5;
  InternalKeyComparator *in_RDX;
  long in_FS_OFFSET;
  FileMetaData *f;
  size_t i;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  InternalKey *in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffc8;
  InternalKey *__n;
  InternalKey *a;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     in_stack_ffffffffffffffc8);
  if (bVar2) {
    local_9 = false;
  }
  else {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_ffffffffffffffc8,(size_type)in_stack_ffffffffffffffc0);
    InternalKey::operator=((InternalKey *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    __n = (InternalKey *)0x1;
    while( true ) {
      a = __n;
      pIVar4 = (InternalKey *)
               std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                         ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      if (pIVar4 <= __n) break;
      ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_ffffffffffffffc8,(size_type)__n);
      in_stack_ffffffffffffffc8 = *ppFVar5;
      iVar3 = InternalKeyComparator::Compare(in_RDX,a,(InternalKey *)in_stack_ffffffffffffffc8);
      if (0 < iVar3) {
        InternalKey::operator=((InternalKey *)in_stack_ffffffffffffffc8,__n);
      }
      __n = (InternalKey *)((long)&(a->rep_)._M_dataplus._M_p + 1);
    }
    local_9 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool FindLargestKey(const InternalKeyComparator& icmp,
                    const std::vector<FileMetaData*>& files,
                    InternalKey* largest_key) {
  if (files.empty()) {
    return false;
  }
  *largest_key = files[0]->largest;
  for (size_t i = 1; i < files.size(); ++i) {
    FileMetaData* f = files[i];
    if (icmp.Compare(f->largest, *largest_key) > 0) {
      *largest_key = f->largest;
    }
  }
  return true;
}